

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqlquerymodel_p.h
# Opt level: O3

QString * QSqlQueryModelSql::leftJoin(QString *__return_storage_ptr__,QString *s)

{
  Data *pDVar1;
  QArrayData *pQVar2;
  QString *pQVar3;
  long *plVar4;
  qsizetype *pqVar5;
  char16_t **ppcVar6;
  long in_FS_OFFSET;
  QByteArrayView QVar7;
  QLatin1String QVar8;
  long local_58;
  char16_t *local_50;
  QArrayData *local_48;
  char16_t *local_40;
  long local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pqVar5 = &(s->d).size;
  QVar7.m_data = (storage_type *)0x9;
  QVar7.m_size = (qsizetype)&local_48;
  QString::fromLatin1(QVar7);
  pQVar2 = local_48;
  local_50 = local_40;
  local_58 = local_38;
  if (local_38 == 0) {
    local_48 = &((s->d).d)->super_QArrayData;
    ppcVar6 = &(s->d).ptr;
  }
  else {
    if (*pqVar5 != 0) {
      if (local_48 != (QArrayData *)0x0) {
        LOCK();
        (local_48->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_48->ref_)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      QVar8.m_data = (char *)0x1;
      QVar8.m_size = (qsizetype)&local_48;
      pQVar3 = (QString *)QString::append(QVar8);
      plVar4 = (long *)QString::append(pQVar3);
      pDVar1 = (Data *)*plVar4;
      (__return_storage_ptr__->d).d = pDVar1;
      (__return_storage_ptr__->d).ptr = (char16_t *)plVar4[1];
      (__return_storage_ptr__->d).size = plVar4[2];
      if (pDVar1 != (Data *)0x0) {
        LOCK();
        (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      if (local_48 != (QArrayData *)0x0) {
        LOCK();
        (local_48->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_48->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_48->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_48,2,0x10);
        }
      }
      goto LAB_00135057;
    }
    ppcVar6 = &local_50;
    pqVar5 = &local_58;
  }
  (__return_storage_ptr__->d).d = (Data *)local_48;
  (__return_storage_ptr__->d).ptr = *ppcVar6;
  (__return_storage_ptr__->d).size = *pqVar5;
  if (local_48 != (QArrayData *)0x0) {
    LOCK();
    (((QArrayData *)&local_48->ref_)->ref_)._q_value.super___atomic_base<int>._M_i =
         (((QArrayData *)&local_48->ref_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
LAB_00135057:
  if (pQVar2 != (QArrayData *)0x0) {
    LOCK();
    (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar2,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

inline const static QString leftJoin(const QString &s) { return concat(leftJoin(), s); }